

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUtil.c
# Opt level: O2

void Abc_SclManPrintGateSizes(SC_Lib *pLib,Abc_Ntk_t *p,Vec_Int_t *vGates)

{
  float fVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  Abc_Obj_t *pObj;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  int i;
  uint uVar8;
  double local_350;
  int Counters [64];
  double Areas [64];
  
  i = 0;
  memset(Counters,0,0x100);
  memset(Areas,0,0x200);
  local_350 = 0.0;
  uVar8 = 0;
  do {
    if (p->vObjs->nSize <= i) {
      printf("Total gates = %d.  Total area = %.1f\n",local_350,(ulong)uVar8);
      for (uVar7 = 0; uVar7 != 0x40; uVar7 = uVar7 + 1) {
        uVar3 = Counters[uVar7];
        if (uVar3 != 0) {
          printf("Cell size = %d.  ",uVar7 & 0xffffffff);
          printf("Count = %6d  ",(ulong)uVar3);
          printf("(%5.1f %%)   ",((double)(int)uVar3 * 100.0) / (double)(int)uVar8);
          dVar2 = Areas[uVar7];
          printf("Area = %12.1f  ");
          printf("(%5.1f %%)  ",(dVar2 * 100.0) / local_350);
          putchar(10);
        }
      }
      return;
    }
    pObj = Abc_NtkObj(p,i);
    if (((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) &&
       ((pObj->vFanins).nSize != 0)) {
      iVar4 = Abc_ObjIsBarBuf(pObj);
      if (iVar4 == 0) {
        iVar4 = Vec_IntEntry(vGates,pObj->Id);
        pvVar5 = Vec_PtrEntry(&pLib->vCells,iVar4);
        lVar6 = (long)*(int *)((long)pvVar5 + 0x68);
        if (0x3f < lVar6) {
          __assert_fail("pCell->Order < ABC_SCL_MAX_SIZE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUtil.c"
                        ,0x89,"void Abc_SclManPrintGateSizes(SC_Lib *, Abc_Ntk_t *, Vec_Int_t *)");
        }
        Counters[lVar6] = Counters[lVar6] + 1;
        fVar1 = *(float *)((long)pvVar5 + 0x18);
        Areas[lVar6] = Areas[lVar6] + (double)fVar1;
        local_350 = local_350 + (double)fVar1;
        uVar8 = uVar8 + 1;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Abc_SclManPrintGateSizes( SC_Lib * pLib, Abc_Ntk_t * p, Vec_Int_t * vGates )
{
    Abc_Obj_t * pObj;
    SC_Cell * pCell;
    int i, nGates = 0, Counters[ABC_SCL_MAX_SIZE] = {0};
    double TotArea = 0, Areas[ABC_SCL_MAX_SIZE] = {0};
    Abc_NtkForEachNodeNotBarBuf1( p, pObj, i )
    {
        pCell = SC_LibCell( pLib, Vec_IntEntry(vGates, Abc_ObjId(pObj)) );
        assert( pCell->Order < ABC_SCL_MAX_SIZE );
        Counters[pCell->Order]++;
        Areas[pCell->Order] += pCell->area;
        TotArea += pCell->area;
        nGates++;
    }
    printf( "Total gates = %d.  Total area = %.1f\n", nGates, TotArea );
    for ( i = 0; i < ABC_SCL_MAX_SIZE; i++ )
    {
        if ( Counters[i] == 0 )
            continue;
        printf( "Cell size = %d.  ", i );
        printf( "Count = %6d  ",     Counters[i] );
        printf( "(%5.1f %%)   ",     100.0 * Counters[i] / nGates );
        printf( "Area = %12.1f  ",   Areas[i] );
        printf( "(%5.1f %%)  ",      100.0 * Areas[i] / TotArea );
        printf( "\n" );
    }
}